

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O2

void issue440(void)

{
  _Bool _Var1;
  roaring_bitmap_t *r;
  
  r = roaring_bitmap_create();
  roaring_bitmap_add_range_closed(r,0x20000,0x2ffff);
  roaring_bitmap_add_range_closed(r,0,0xffff);
  _Var1 = roaring_bitmap_contains_range(r,0,0x11001);
  _assert_true((ulong)!_Var1,"roaring_bitmap_contains_range(b1, 0, largest_item + 1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x88);
  _Var1 = roaring_bitmap_contains(r,0x11000);
  _assert_true((ulong)!_Var1,"roaring_bitmap_contains(b1, largest_item)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x89);
  roaring_bitmap_free(r);
  return;
}

Assistant:

DEFINE_TEST(issue440) {
    roaring_bitmap_t *b1 = roaring_bitmap_create();
    roaring_bitmap_add_range_closed(b1, 0x20000, 0x2FFFF);
    roaring_bitmap_add_range_closed(b1, 0, 0xFFFF);
    uint32_t largest_item = 0x11000;
    assert_false(roaring_bitmap_contains_range(b1, 0, largest_item + 1));
    assert_false(roaring_bitmap_contains(b1, largest_item));
    roaring_bitmap_free(b1);
}